

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

void __thiscall cmDebugger_impl::ClearListeners(cmDebugger_impl *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->listeners)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<cmDebuggerListener_*,_cmDebuggerListener_*,_std::_Identity<cmDebuggerListener_*>,_std::less<cmDebuggerListener_*>,_std::allocator<cmDebuggerListener_*>_>
  ::clear(&(this->listeners)._M_t);
  return;
}

Assistant:

void ClearListeners() override
  {
    for (auto& s : listeners) {
      delete s;
    }
    listeners.clear();
  }